

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotNotificationListView.cpp
# Opt level: O0

void __thiscall SlotNotificationListView::display(SlotNotificationListView *this)

{
  display((SlotNotificationListView *)
          &this[-1].super_ListView<Slot>.super_View.menuOptions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void SlotNotificationListView::display() {
    vector<Slot> temp = getQueryset();
    if (!temp.empty()) {
        cout << "Here is the list of slot requests that you've made: \n";
        for (auto &slot : temp) {
            cout << slot.getId() << ". " << slot.getRoom().getRoomNumber() << " " << slot.getStartTime().getTimestamp()
                 << " " << slot.getEndTime().getTimestamp() << "\n";
            cout << "\tApproved status: ";
            if (slot.getApproved() == 1) cout << "Approved\n";
            else if (slot.getApproved() == 2) cout << "Denied\n";
            else cout << "Pending\n";
        }
    } else cout << "No slot requests to show!\n";
    response->view = Controller::getInstance().getView("faculty-panel");
}